

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_erkstep.c
# Opt level: O0

int erkStep_Init(ARKodeMem ark_mem,sunrealtype tout,int init_type)

{
  int iVar1;
  int iVar2;
  void *pvVar3;
  ARKRwtFn p_Var4;
  int in_ESI;
  ARKodeMem in_RDI;
  ARKodeMem in_XMM0_Qa;
  int j;
  int retval;
  int reset_efun;
  ARKodeERKStepMem step_mem;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  int iVar5;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  uint uVar6;
  ARKodeMem in_stack_ffffffffffffffd8;
  int local_4;
  
  local_4 = erkStep_AccessStepMem
                      (in_stack_ffffffffffffffd8,
                       (char *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                       (ARKodeERKStepMem *)
                       CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  if (local_4 == 0) {
    if ((in_ESI == 2) || (in_ESI == 1)) {
      local_4 = 0;
    }
    else {
      uVar6 = (uint)(in_RDI->fixedstep != 0);
      if (in_RDI->user_efun != 0) {
        uVar6 = 0;
      }
      if (in_RDI->AccumErrorType != ARK_ACCUMERROR_NONE) {
        uVar6 = 0;
      }
      if (uVar6 != 0) {
        in_RDI->user_efun = 0;
        in_RDI->efun = arkEwtSetSmallReal;
        in_RDI->e_data = in_RDI;
      }
      iVar1 = erkStep_SetButcherTable(in_XMM0_Qa);
      if (iVar1 == 0) {
        iVar1 = erkStep_CheckButcherTable(in_XMM0_Qa);
        if (iVar1 == 0) {
          iVar5 = *(int *)in_stack_ffffffffffffffd8->Sabstol;
          in_RDI->hadapt_mem->q = iVar5;
          in_stack_ffffffffffffffd8->itol = iVar5;
          iVar5 = *(int *)((long)in_stack_ffffffffffffffd8->Sabstol + 4);
          in_RDI->hadapt_mem->p = iVar5;
          in_stack_ffffffffffffffd8->ritol = iVar5;
          if (((in_RDI->fixedstep == 0) || (in_RDI->AccumErrorType != ARK_ACCUMERROR_NONE)) &&
             (in_stack_ffffffffffffffd8->ritol == 0)) {
            arkProcessError(in_RDI,-0x16,0x1c6,"erkStep_Init",
                            "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_erkstep.c"
                            ,
                            "Temporal error estimation cannot be performed without embedding coefficients"
                           );
            local_4 = -0x16;
          }
          else {
            if (in_stack_ffffffffffffffd8->user_data == (void *)0x0) {
              pvVar3 = calloc((long)*(int *)&in_stack_ffffffffffffffd8->reltol,8);
              in_stack_ffffffffffffffd8->user_data = pvVar3;
            }
            for (iVar5 = 0; iVar5 < *(int *)&in_stack_ffffffffffffffd8->reltol; iVar5 = iVar5 + 1) {
              iVar2 = arkAllocVec(in_stack_ffffffffffffffd8,(N_Vector)CONCAT44(uVar6,iVar1),
                                  (N_Vector *)CONCAT44(iVar5,in_stack_ffffffffffffffc8));
              if (iVar2 == 0) {
                return -0x14;
              }
            }
            in_RDI->liw = (long)*(int *)&in_stack_ffffffffffffffd8->reltol + in_RDI->liw;
            *(int *)&in_stack_ffffffffffffffd8->VRabstol =
                 *(int *)&in_stack_ffffffffffffffd8->reltol * 2 + 2 +
                 in_stack_ffffffffffffffd8->user_rfun;
            if (*(long *)&in_stack_ffffffffffffffd8->atolmin0 == 0) {
              pvVar3 = calloc((long)*(int *)&in_stack_ffffffffffffffd8->VRabstol,8);
              *(void **)&in_stack_ffffffffffffffd8->atolmin0 = pvVar3;
              if (*(long *)&in_stack_ffffffffffffffd8->atolmin0 == 0) {
                return -0x14;
              }
              in_RDI->lrw = (long)*(int *)&in_stack_ffffffffffffffd8->VRabstol + in_RDI->lrw;
            }
            if (in_stack_ffffffffffffffd8->SRabstol == 0.0) {
              pvVar3 = calloc((long)*(int *)&in_stack_ffffffffffffffd8->VRabstol,8);
              in_stack_ffffffffffffffd8->SRabstol = (sunrealtype)pvVar3;
              if (in_stack_ffffffffffffffd8->SRabstol == 0.0) {
                return -0x14;
              }
              in_RDI->liw = (long)*(int *)&in_stack_ffffffffffffffd8->VRabstol + in_RDI->liw;
            }
            if (0 < in_stack_ffffffffffffffd8->user_rfun) {
              if (in_stack_ffffffffffffffd8->rfun == (ARKRwtFn)0x0) {
                p_Var4 = (ARKRwtFn)calloc((long)*(int *)&in_stack_ffffffffffffffd8->reltol,8);
                in_stack_ffffffffffffffd8->rfun = p_Var4;
                in_RDI->lrw = (long)*(int *)&in_stack_ffffffffffffffd8->reltol + in_RDI->lrw;
              }
              if (in_stack_ffffffffffffffd8->r_data == (void *)0x0) {
                pvVar3 = calloc((long)*(int *)&in_stack_ffffffffffffffd8->reltol,8);
                in_stack_ffffffffffffffd8->r_data = pvVar3;
                in_RDI->lrw = (long)*(int *)&in_stack_ffffffffffffffd8->reltol + in_RDI->lrw;
              }
            }
            if ((in_stack_ffffffffffffffd8->itol < 2) ||
               (in_RDI->interp_degree <= in_stack_ffffffffffffffd8->itol + -1)) {
              if ((in_stack_ffffffffffffffd8->itol == 1) && (1 < in_RDI->interp_degree)) {
                in_RDI->interp_degree = 1;
              }
            }
            else {
              in_RDI->interp_degree = in_stack_ffffffffffffffd8->itol + -1;
            }
            if (in_RDI->do_adjoint == 0) {
              in_RDI->step = erkStep_TakeStep;
            }
            else {
              in_RDI->step = erkStep_TakeStep_Adjoint;
            }
            in_RDI->call_fullrhs = 1;
            local_4 = 0;
          }
        }
        else {
          arkProcessError(in_RDI,-0x16,0x1b8,"erkStep_Init",
                          "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_erkstep.c"
                          ,"Error in Butcher table");
          local_4 = -0x16;
        }
      }
      else {
        arkProcessError(in_RDI,-0x16,0x1af,"erkStep_Init",
                        "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_erkstep.c"
                        ,"Could not create Butcher table");
        local_4 = -0x16;
      }
    }
  }
  return local_4;
}

Assistant:

int erkStep_Init(ARKodeMem ark_mem, SUNDIALS_MAYBE_UNUSED sunrealtype tout,
                 int init_type)
{
  ARKodeERKStepMem step_mem;
  sunbooleantype reset_efun;
  int retval, j;

  /* access ARKodeERKStepMem structure */
  retval = erkStep_AccessStepMem(ark_mem, __func__, &step_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  /* immediately return if resize or reset */
  if (init_type == RESIZE_INIT || init_type == RESET_INIT)
  {
    return (ARK_SUCCESS);
  }

  /* enforce use of arkEwtSmallReal if using a fixed step size,
     an internal error weight function, and not performing accumulated
     temporal error estimation */
  reset_efun = SUNTRUE;
  if (!ark_mem->fixedstep) { reset_efun = SUNFALSE; }
  if (ark_mem->user_efun) { reset_efun = SUNFALSE; }
  if (ark_mem->AccumErrorType != ARK_ACCUMERROR_NONE) { reset_efun = SUNFALSE; }
  if (reset_efun)
  {
    ark_mem->user_efun = SUNFALSE;
    ark_mem->efun      = arkEwtSetSmallReal;
    ark_mem->e_data    = ark_mem;
  }

  /* Create Butcher table (if not already set) */
  retval = erkStep_SetButcherTable(ark_mem);
  if (retval != ARK_SUCCESS)
  {
    arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "Could not create Butcher table");
    return (ARK_ILL_INPUT);
  }

  /* Check that Butcher table are OK */
  retval = erkStep_CheckButcherTable(ark_mem);
  if (retval != ARK_SUCCESS)
  {
    arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "Error in Butcher table");
    return (ARK_ILL_INPUT);
  }

  /* Retrieve/store method and embedding orders now that table is finalized */
  step_mem->q = ark_mem->hadapt_mem->q = step_mem->B->q;
  step_mem->p = ark_mem->hadapt_mem->p = step_mem->B->p;

  /* Ensure that if adaptivity or error accumulation is enabled, then
       method includes embedding coefficients */
  if ((!ark_mem->fixedstep || (ark_mem->AccumErrorType != ARK_ACCUMERROR_NONE)) &&
      (step_mem->p == 0))
  {
    arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__,
                    __FILE__, "Temporal error estimation cannot be performed without embedding coefficients");
    return (ARK_ILL_INPUT);
  }

  /* Allocate ARK RHS vector memory, update storage requirements */
  /*   Allocate F[0] ... F[stages-1] if needed */
  if (step_mem->F == NULL)
  {
    step_mem->F = (N_Vector*)calloc(step_mem->stages, sizeof(N_Vector));
  }
  for (j = 0; j < step_mem->stages; j++)
  {
    if (!arkAllocVec(ark_mem, ark_mem->ewt, &(step_mem->F[j])))
    {
      return (ARK_MEM_FAIL);
    }
  }
  ark_mem->liw += step_mem->stages; /* pointers */

  /* Allocate reusable arrays for fused vector interface */
  step_mem->nfusedopvecs = 2 * step_mem->stages + 2 + step_mem->nforcing;
  if (step_mem->cvals == NULL)
  {
    step_mem->cvals = (sunrealtype*)calloc(step_mem->nfusedopvecs,
                                           sizeof(sunrealtype));
    if (step_mem->cvals == NULL) { return (ARK_MEM_FAIL); }
    ark_mem->lrw += step_mem->nfusedopvecs;
  }
  if (step_mem->Xvecs == NULL)
  {
    step_mem->Xvecs = (N_Vector*)calloc(step_mem->nfusedopvecs, sizeof(N_Vector));
    if (step_mem->Xvecs == NULL) { return (ARK_MEM_FAIL); }
    ark_mem->liw += step_mem->nfusedopvecs; /* pointers */
  }

  /* Allocate workspace for MRI forcing -- need to allocate here as the
     number of stages may not bet set before this point and we assume
     SetInnerForcing has been called before the first step i.e., methods
     start with a fast integration */
  if (step_mem->nforcing > 0)
  {
    if (!(step_mem->stage_times))
    {
      step_mem->stage_times = (sunrealtype*)calloc(step_mem->stages,
                                                   sizeof(sunrealtype));
      ark_mem->lrw += step_mem->stages;
    }

    if (!(step_mem->stage_coefs))
    {
      step_mem->stage_coefs = (sunrealtype*)calloc(step_mem->stages,
                                                   sizeof(sunrealtype));
      ark_mem->lrw += step_mem->stages;
    }
  }

  /* Override the interpolant degree (if needed), used in arkInitialSetup */
  if (step_mem->q > 1 && ark_mem->interp_degree > (step_mem->q - 1))
  {
    /* Limit max degree to at most one less than the method global order */
    ark_mem->interp_degree = step_mem->q - 1;
  }
  else if (step_mem->q == 1 && ark_mem->interp_degree > 1)
  {
    /* Allow for linear interpolant with first order methods to ensure
       solution values are returned at the time interval end points */
    ark_mem->interp_degree = 1;
  }

  /* set appropriate TakeStep routine based on problem configuration */
  if (ark_mem->do_adjoint) { ark_mem->step = erkStep_TakeStep_Adjoint; }
  else { ark_mem->step = erkStep_TakeStep; }

  /* Signal to shared arkode module that full RHS evaluations are required */
  ark_mem->call_fullrhs = SUNTRUE;

  return (ARK_SUCCESS);
}